

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::Copy(aiNodeAnim **_dest,aiNodeAnim *src)

{
  undefined8 *puVar1;
  uint uVar2;
  aiVectorKey *paVar3;
  aiQuatKey *__src;
  aiNodeAnim *__dest;
  aiVectorKey *paVar4;
  aiQuatKey *__dest_00;
  ulong uVar5;
  aiQuatKey *paVar6;
  ulong uVar7;
  
  if (src != (aiNodeAnim *)0x0 && _dest != (aiNodeAnim **)0x0) {
    __dest = (aiNodeAnim *)operator_new(0x438);
    (__dest->mNodeName).length = 0;
    (__dest->mNodeName).data[0] = '\0';
    memset((__dest->mNodeName).data + 1,0x1b,0x3ff);
    __dest->mRotationKeys = (aiQuatKey *)0x0;
    __dest->mNumScalingKeys = 0;
    *(undefined8 *)&__dest->mNumPositionKeys = 0;
    *(undefined8 *)((long)&__dest->mPositionKeys + 4) = 0;
    __dest->mScalingKeys = (aiVectorKey *)0x0;
    __dest->mPreState = aiAnimBehaviour_DEFAULT;
    __dest->mPostState = aiAnimBehaviour_DEFAULT;
    *_dest = __dest;
    memcpy(__dest,src,0x438);
    paVar3 = __dest->mPositionKeys;
    if (paVar3 != (aiVectorKey *)0x0) {
      uVar2 = __dest->mNumPositionKeys;
      uVar7 = (ulong)uVar2 * 0x18;
      paVar4 = (aiVectorKey *)operator_new__(uVar7);
      if ((ulong)uVar2 != 0) {
        uVar5 = 0;
        do {
          puVar1 = (undefined8 *)((long)&paVar4->mTime + uVar5);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)&(paVar4->mValue).z + uVar5) = 0;
          uVar5 = uVar5 + 0x18;
        } while (uVar7 != uVar5);
      }
      __dest->mPositionKeys = paVar4;
      memcpy(paVar4,paVar3,uVar7);
    }
    paVar3 = __dest->mScalingKeys;
    if (paVar3 != (aiVectorKey *)0x0) {
      uVar2 = __dest->mNumScalingKeys;
      uVar7 = (ulong)uVar2 * 0x18;
      paVar4 = (aiVectorKey *)operator_new__(uVar7);
      if ((ulong)uVar2 != 0) {
        uVar5 = 0;
        do {
          puVar1 = (undefined8 *)((long)&paVar4->mTime + uVar5);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)&(paVar4->mValue).z + uVar5) = 0;
          uVar5 = uVar5 + 0x18;
        } while (uVar7 != uVar5);
      }
      __dest->mScalingKeys = paVar4;
      memcpy(paVar4,paVar3,uVar7);
    }
    __src = __dest->mRotationKeys;
    if (__src != (aiQuatKey *)0x0) {
      uVar7 = (ulong)__dest->mNumRotationKeys;
      __dest_00 = (aiQuatKey *)operator_new__(uVar7 * 0x18);
      if (uVar7 != 0) {
        paVar6 = __dest_00;
        do {
          paVar6->mTime = 0.0;
          (paVar6->mValue).w = 1.0;
          (paVar6->mValue).x = 0.0;
          (paVar6->mValue).y = 0.0;
          (paVar6->mValue).z = 0.0;
          paVar6 = paVar6 + 1;
        } while (paVar6 != __dest_00 + uVar7);
      }
      __dest->mRotationKeys = __dest_00;
      memcpy(__dest_00,__src,uVar7 * 0x18);
      return;
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiNodeAnim** _dest, const aiNodeAnim* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiNodeAnim* dest = *_dest = new aiNodeAnim();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiNodeAnim));

    // and reallocate all arrays
    GetArrayCopy( dest->mPositionKeys, dest->mNumPositionKeys );
    GetArrayCopy( dest->mScalingKeys,  dest->mNumScalingKeys );
    GetArrayCopy( dest->mRotationKeys, dest->mNumRotationKeys );
}